

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O1

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx_functor::binary_op_min>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  ulong uVar6;
  undefined1 (*pauVar7) [32];
  uint uVar8;
  undefined1 (*pauVar9) [32];
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  
  uVar2 = b->c;
  uVar8 = b->h * b->w * b->d * b->elempack;
  Mat::create_like(c,b,opt->blob_allocator);
  iVar10 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar2) {
      uVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [32])(b->cstep * uVar6 * b->elemsize + (long)b->data);
        pauVar9 = (undefined1 (*) [32])(c->cstep * uVar6 * c->elemsize + (long)c->data);
        uVar1 = *a->data;
        auVar14._4_4_ = uVar1;
        auVar14._0_4_ = uVar1;
        auVar14._8_4_ = uVar1;
        auVar14._12_4_ = uVar1;
        auVar15._16_4_ = uVar1;
        auVar15._0_16_ = auVar14;
        auVar15._20_4_ = uVar1;
        auVar15._24_4_ = uVar1;
        auVar15._28_4_ = uVar1;
        if ((int)uVar8 < 8) {
          uVar11 = 0;
        }
        else {
          iVar10 = 7;
          do {
            auVar4 = vminps_avx(auVar15,*pauVar7);
            *pauVar9 = auVar4;
            pauVar7 = pauVar7 + 1;
            pauVar9 = pauVar9 + 1;
            iVar10 = iVar10 + 8;
            uVar11 = uVar8 & 0xfffffff8;
          } while (iVar10 < (int)uVar8);
        }
        if ((int)(uVar11 | 3) < (int)uVar8) {
          auVar5 = vshufps_avx(auVar14,auVar14,0);
          uVar12 = uVar11;
          do {
            auVar3 = vminps_avx(auVar5,*(undefined1 (*) [16])*pauVar7);
            *(undefined1 (*) [16])*pauVar9 = auVar3;
            pauVar7 = (undefined1 (*) [32])(*pauVar7 + 0x10);
            pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
            uVar11 = uVar12 + 4;
            iVar10 = uVar12 + 7;
            uVar12 = uVar11;
          } while (iVar10 < (int)uVar8);
        }
        if (uVar8 - uVar11 != 0 && (int)uVar11 <= (int)uVar8) {
          lVar13 = 0;
          do {
            auVar5 = vminss_avx(auVar14,ZEXT416(*(uint *)(*pauVar7 + lVar13 * 4)));
            *(int *)(*pauVar9 + lVar13 * 4) = auVar5._0_4_;
            lVar13 = lVar13 + 1;
          } while (uVar8 - uVar11 != (int)lVar13);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar2);
    }
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}